

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O3

float VW_Predict(VW_HANDLE handle,VW_EXAMPLE e)

{
  single_learner *psVar1;
  float fVar2;
  
  psVar1 = LEARNER::as_singleline<char,char>(*(learner<char,_char> **)((long)handle + 0x28));
  (**(code **)(psVar1 + 0x30))(*(undefined8 *)(psVar1 + 0x18),*(undefined8 *)(psVar1 + 0x20),e);
  fVar2 = VW::get_prediction((example *)e);
  return fVar2;
}

Assistant:

VW_DLL_MEMBER float VW_CALLING_CONV VW_Predict(VW_HANDLE handle, VW_EXAMPLE e)
{ vw * pointer = static_cast<vw*>(handle);
  example * ex = static_cast<example*>(e);
  LEARNER::as_singleline(pointer->l)->predict(*ex);
  //BUG: The below method may return garbage as it assumes a certain structure for ex->ld
  //which may not be the actual one used (e.g., for cost-sensitive multi-class learning)
  return VW::get_prediction(ex);
}